

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExplicitCovariance.hpp
# Opt level: O1

vector<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>_>_>
* __thiscall
njoy::ENDFtk::readSequence<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
          (vector<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>_>_>
           *__return_storage_ptr__,ENDFtk *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT,int MF,int MT,int size)

{
  undefined8 *puVar1;
  ListRecord list;
  CovariancePairs local_c0;
  ListRecord local_78;
  
  (__return_storage_ptr__->
  super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>_>_>
  ::reserve(__return_storage_ptr__,(long)MT);
  if (MT != 0) {
    do {
      ListRecord::ListRecord<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                (&local_78,
                 (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)this,begin,(long *)end,(int)lineNumber,MAT,MF);
      if (9 < (ulong)local_78.metadata.fields.
                     super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                     super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                     super__Tuple_impl<2UL,_long,_long,_long,_long>.
                     super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
                     _M_head_impl) {
LAB_001387c6:
        tools::Log::error<char_const*>("Encountered illegal LB value");
        tools::Log::info<char_const*>("LB can only be 0,1,2,3,4,5,6,8,9");
        tools::Log::info<char_const*,long>
                  ("LB value: {}",
                   local_78.metadata.fields.
                   super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                   super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                   super__Tuple_impl<2UL,_long,_long,_long,_long>.
                   super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
                   _M_head_impl);
        tools::Log::info<char_const*,long>("Line number: {}",(long)(end->_M_current + -1));
        puVar1 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar1 = getenv;
        __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
      }
      if ((799UL >> (local_78.metadata.fields.
                     super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                     super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                     super__Tuple_impl<2UL,_long,_long,_long,_long>.
                     super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
                     _M_head_impl & 0x3fU) & 1) == 0) {
        if (local_78.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
            super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
            super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
            super__Head_base<3UL,_long,_false>._M_head_impl == 5) {
          section::SquareMatrix::SquareMatrix((SquareMatrix *)&local_c0,&local_78);
          std::
          vector<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>_>_>
          ::emplace_back<njoy::ENDFtk::section::SquareMatrix>
                    (__return_storage_ptr__,(SquareMatrix *)&local_c0);
        }
        else {
          if (local_78.metadata.fields.
              super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
              super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
              super__Tuple_impl<2UL,_long,_long,_long,_long>.
              super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
              _M_head_impl != 6) goto LAB_001387c6;
          section::RectangularMatrix::RectangularMatrix((RectangularMatrix *)&local_c0,&local_78);
          std::
          vector<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>_>_>
          ::emplace_back<njoy::ENDFtk::section::RectangularMatrix>
                    (__return_storage_ptr__,(RectangularMatrix *)&local_c0);
        }
      }
      else {
        section::CovariancePairs::CovariancePairs(&local_c0,&local_78);
        std::
        vector<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>_>_>
        ::emplace_back<njoy::ENDFtk::section::CovariancePairs>(__return_storage_ptr__,&local_c0);
      }
      if (local_c0.super_ListRecord.data.super__Vector_base<double,_std::allocator<double>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c0.super_ListRecord.data.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_c0.super_ListRecord.data.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_c0.super_ListRecord.data.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_78.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_78.data.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_78.data.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      MT = MT + -1;
    } while (MT != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector< section::ExplicitCovariance >
readSequence( Iterator& begin,
              const Iterator& end,
              long& lineNumber,
              int MAT,
              int MF,
              int MT,
              int size ) {

  std::vector< section::ExplicitCovariance > sequence;
  sequence.reserve( size );

  while ( size-- ) {

    ListRecord list( begin, end, lineNumber, MAT, MF, MT );

    switch ( list.L2() ) {

      // CovariancePairs
      case 0:
      case 1:
      case 2:
      case 3:
      case 4:
      case 8:
      case 9:
        sequence.emplace_back( section::CovariancePairs( std::move( list ) ) );
        break;

      // SquareMatrix
      case 5:
        sequence.emplace_back( section::SquareMatrix( std::move( list ) ) );
        break;

      // RectangularMatrix
      case 6:
        sequence.emplace_back( section::RectangularMatrix( std::move( list ) ) );
        break;

      // Error
      default:
        Log::error( "Encountered illegal LB value" );
        Log::info( "LB can only be 0,1,2,3,4,5,6,8,9" );
        Log::info( "LB value: {}", list.L2() );
        Log::info( "Line number: {}", lineNumber - 1 );
        throw std::exception();
    }
  }

  return sequence;
}